

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_XXX.cpp
# Opt level: O0

bool __thiscall EnvironmentXXX::InitializeEnv(EnvironmentXXX *this,char *sEnvFile)

{
  _Ios_Openmode _Var1;
  SBPL_Exception *this_00;
  char *in_RSI;
  long *in_RDI;
  stringstream ss;
  FILE *fCfg;
  string *in_stack_fffffffffffffdd8;
  allocator<char> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  allocator<char> local_1c1;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  FILE *local_18;
  char *local_10;
  
  local_10 = in_RSI;
  local_18 = fopen(in_RSI,"r");
  if (local_18 == (FILE *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    _Var1 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_1a0,local_1c0,_Var1);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::operator<<(local_190,local_10);
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    SBPL_Exception::SBPL_Exception(this_00,in_stack_fffffffffffffdd8);
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  (**(code **)(*in_RDI + 0xe0))(in_RDI,local_18);
  fclose(local_18);
  (**(code **)(*in_RDI + 0xe8))();
  (**(code **)(*in_RDI + 0x118))();
  (**(code **)(*in_RDI + 0x128))();
  return true;
}

Assistant:

bool EnvironmentXXX::InitializeEnv(const char* sEnvFile)
{
    FILE* fCfg = fopen(sEnvFile, "r");
    if (fCfg == NULL) {
        std::stringstream ss("ERROR: unable to open ");
        ss << sEnvFile;
        throw SBPL_Exception(ss.str());
    }
    ReadConfiguration(fCfg);
    fclose(fCfg);

    //Initialize other parameters of the environment
    InitializeEnvConfig();

    //initialize Environment
    InitializeEnvironment();

    //pre-compute heuristics
    ComputeHeuristicValues();

    return true;
}